

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hmac_drbg.c
# Opt level: O0

void mbedtls_hmac_drbg_free(mbedtls_hmac_drbg_context *ctx)

{
  mbedtls_hmac_drbg_context *ctx_local;
  
  if (ctx != (mbedtls_hmac_drbg_context *)0x0) {
    mbedtls_md_free(&ctx->md_ctx);
    mbedtls_zeroize(ctx,0x80);
  }
  return;
}

Assistant:

void mbedtls_hmac_drbg_free( mbedtls_hmac_drbg_context *ctx )
{
    if( ctx == NULL )
        return;

#if defined(MBEDTLS_THREADING_C)
    mbedtls_mutex_free( &ctx->mutex );
#endif
    mbedtls_md_free( &ctx->md_ctx );
    mbedtls_zeroize( ctx, sizeof( mbedtls_hmac_drbg_context ) );
}